

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUtilitySourceCommand.cxx
# Opt level: O2

bool cmUtilitySourceCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  cmMakefile *pcVar1;
  bool bVar2;
  uint uVar3;
  cmValue cVar4;
  string *psVar5;
  cmState *this;
  char *pcVar6;
  string *psVar7;
  cmValue cVar8;
  ulong uVar9;
  cmExecutionStatus *pcVar10;
  allocator<char> local_179;
  string *local_178;
  cmExecutionStatus *local_170;
  string utilitySource;
  string utilityDirectory;
  string utilityExecutable;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string exePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_178 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)local_178;
  if (uVar9 < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&utilitySource,"called with incorrect number of arguments",
               (allocator<char> *)&utilityDirectory);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&utilitySource);
  }
  else {
    cVar4 = cmMakefile::GetDefinition(status->Makefile,local_178);
    pcVar1 = status->Makefile;
    local_170 = status;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&utilitySource,"CMAKE_CFG_INTDIR",(allocator<char> *)&utilityDirectory);
    psVar5 = cmMakefile::GetRequiredDefinition(pcVar1,&utilitySource);
    std::__cxx11::string::~string((string *)&utilitySource);
    pcVar1 = local_170->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&utilitySource,"CMAKE_CROSSCOMPILING",(allocator<char> *)&utilityDirectory)
    ;
    bVar2 = cmMakefile::IsOn(pcVar1,&utilitySource);
    std::__cxx11::string::~string((string *)&utilitySource);
    if (bVar2) {
      bVar2 = operator!=(cVar4,(nullptr_t)0x0);
      if (bVar2) goto LAB_0039a026;
      cmStrCat<char_const(&)[52],std::__cxx11::string_const&,char_const(&)[160]>
                (&utilitySource,(char (*) [52])"UTILITY_SOURCE is used in cross compiling mode for "
                 ,local_178,
                 (char (*) [160])
                 ". If your intention is to run this executable, you need to preload the cache with the full path to a version of that program, which runs on this build machine."
                );
      cmSystemTools::Message(&utilitySource,"Warning");
      std::__cxx11::string::~string((string *)&utilitySource);
    }
    else {
      this = cmMakefile::GetState(local_170->Makefile);
      if (((cVar4.Value != (string *)0x0) &&
          (((pcVar6 = strstr(((cVar4.Value)->_M_dataplus)._M_p,"(IntDir)"), pcVar6 == (char *)0x0 ||
            (bVar2 = std::operator==(psVar5,"$(IntDir)"), bVar2)) &&
           (uVar3 = cmState::GetCacheMajorVersion(this), uVar3 != 0)))) &&
         (uVar3 = cmState::GetCacheMinorVersion(this), uVar3 != 0)) goto LAB_0039a026;
    }
    pcVar10 = local_170;
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_170->Makefile);
    std::__cxx11::string::string((string *)&utilitySource,(string *)psVar5);
    std::operator+(&exePath,&utilitySource,"/");
    __rhs = local_178 + 2;
    std::operator+(&utilityDirectory,&exePath,__rhs);
    std::__cxx11::string::operator=((string *)&utilitySource,(string *)&utilityDirectory);
    std::__cxx11::string::~string((string *)&utilityDirectory);
    std::__cxx11::string::~string((string *)&exePath);
    bVar2 = cmsys::SystemTools::FileExists(&utilitySource);
    if (bVar2) {
      cVar4.Value = local_178 + 1;
      psVar5 = local_178 + 3;
      do {
        if (psVar5 == (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          pcVar1 = pcVar10->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&utilityDirectory,"CMAKE_CFG_INTDIR",(allocator<char> *)&exePath);
          psVar5 = cmMakefile::GetRequiredDefinition(pcVar1,&utilityDirectory);
          std::__cxx11::string::~string((string *)&utilityDirectory);
          psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar10->Makefile);
          std::__cxx11::string::string((string *)&utilityDirectory,(string *)psVar7);
          exePath._M_dataplus._M_p = (pointer)&exePath.field_2;
          exePath._M_string_length = 0;
          exePath.field_2._M_local_buf[0] = '\0';
          pcVar1 = pcVar10->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&utilityExecutable,"EXECUTABLE_OUTPUT_PATH",
                     (allocator<char> *)&local_108);
          cVar8 = cmMakefile::GetDefinition(pcVar1,&utilityExecutable);
          std::__cxx11::string::~string((string *)&utilityExecutable);
          if (cVar8.Value != (string *)0x0) {
            std::__cxx11::string::_M_assign((string *)&exePath);
          }
          if (exePath._M_string_length == 0) {
            std::operator+(&utilityExecutable,"/",__rhs);
            std::__cxx11::string::append((string *)&utilityDirectory);
            std::__cxx11::string::~string((string *)&utilityExecutable);
          }
          else {
            std::__cxx11::string::_M_assign((string *)&utilityDirectory);
          }
          std::operator+(&local_70,&utilityDirectory,"/");
          std::operator+(&local_50,&local_70,psVar5);
          std::operator+(&local_b0,&local_50,"/");
          std::operator+(&local_108,&local_b0,cVar4.Value);
          pcVar1 = pcVar10->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"CMAKE_EXECUTABLE_SUFFIX",&local_179);
          psVar5 = (string *)cmMakefile::GetDefinition(pcVar1,&local_90);
          if (psVar5 == (string *)0x0) {
            psVar5 = &cmValue::Empty_abi_cxx11_;
          }
          std::operator+(&utilityExecutable,&local_108,psVar5);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          cmsys::SystemTools::ReplaceString(&utilityExecutable,"/./","/");
          pcVar1 = pcVar10->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_108,"Path to an internal program.",
                     (allocator<char> *)&local_b0);
          cmMakefile::AddCacheDefinition
                    (pcVar1,local_178,&utilityExecutable,&local_108,FILEPATH,false);
          std::__cxx11::string::~string((string *)&local_108);
          cmsys::SystemTools::ConvertToUnixSlashes(&utilityExecutable);
          pcVar1 = pcVar10->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_108,"Executable to project name.",(allocator<char> *)&local_b0
                    );
          cmMakefile::AddCacheDefinition(pcVar1,&utilityExecutable,cVar4,&local_108,INTERNAL,false);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&utilityExecutable);
          std::__cxx11::string::~string((string *)&exePath);
          std::__cxx11::string::~string((string *)&utilityDirectory);
          break;
        }
        std::operator+(&exePath,&utilitySource,"/");
        std::operator+(&utilityDirectory,&exePath,psVar5);
        std::__cxx11::string::~string((string *)&exePath);
        bVar2 = cmsys::SystemTools::FileExists(&utilityDirectory);
        psVar5 = psVar5 + 1;
        std::__cxx11::string::~string((string *)&utilityDirectory);
        pcVar10 = local_170;
      } while (bVar2);
    }
    std::__cxx11::string::~string((string *)&utilitySource);
  }
LAB_0039a026:
  return 0x40 < uVar9;
}

Assistant:

bool cmUtilitySourceCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  auto arg = args.begin();

  // The first argument is the cache entry name.
  std::string const& cacheEntry = *arg++;
  cmValue cacheValue = status.GetMakefile().GetDefinition(cacheEntry);
  // If it exists already and appears up to date then we are done.  If
  // the string contains "(IntDir)" but that is not the
  // CMAKE_CFG_INTDIR setting then the value is out of date.
  std::string const& intDir =
    status.GetMakefile().GetRequiredDefinition("CMAKE_CFG_INTDIR");

  bool haveCacheValue = false;
  if (status.GetMakefile().IsOn("CMAKE_CROSSCOMPILING")) {
    haveCacheValue = (cacheValue != nullptr);
    if (!haveCacheValue) {
      std::string msg = cmStrCat(
        "UTILITY_SOURCE is used in cross compiling mode for ", cacheEntry,
        ". If your intention is to run this executable, you need to "
        "preload the cache with the full path to a version of that "
        "program, which runs on this build machine.");
      cmSystemTools::Message(msg, "Warning");
    }
  } else {
    cmState* state = status.GetMakefile().GetState();
    haveCacheValue = (cacheValue &&
                      (strstr(cacheValue->c_str(), "(IntDir)") == nullptr ||
                       (intDir == "$(IntDir)")) &&
                      (state->GetCacheMajorVersion() != 0 &&
                       state->GetCacheMinorVersion() != 0));
  }

  if (haveCacheValue) {
    return true;
  }

  // The second argument is the utility's executable name, which will be
  // needed later.
  std::string const& utilityName = *arg++;

  // The third argument specifies the relative directory of the source
  // of the utility.
  std::string const& relativeSource = *arg++;
  std::string utilitySource = status.GetMakefile().GetCurrentSourceDirectory();
  utilitySource = utilitySource + "/" + relativeSource;

  // If the directory doesn't exist, the source has not been included.
  if (!cmSystemTools::FileExists(utilitySource)) {
    return true;
  }

  // Make sure all the files exist in the source directory.
  while (arg != args.end()) {
    std::string file = utilitySource + "/" + *arg++;
    if (!cmSystemTools::FileExists(file)) {
      return true;
    }
  }

  // The source exists.
  const std::string& cmakeCFGout =
    status.GetMakefile().GetRequiredDefinition("CMAKE_CFG_INTDIR");
  std::string utilityDirectory =
    status.GetMakefile().GetCurrentBinaryDirectory();
  std::string exePath;
  if (cmValue d =
        status.GetMakefile().GetDefinition("EXECUTABLE_OUTPUT_PATH")) {
    exePath = *d;
  }
  if (!exePath.empty()) {
    utilityDirectory = exePath;
  } else {
    utilityDirectory += "/" + relativeSource;
  }

  // Construct the cache entry for the executable's location.
  std::string utilityExecutable = utilityDirectory + "/" + cmakeCFGout + "/" +
    utilityName +
    *status.GetMakefile().GetDefinition("CMAKE_EXECUTABLE_SUFFIX");

  // make sure we remove any /./ in the name
  cmSystemTools::ReplaceString(utilityExecutable, "/./", "/");

  // Enter the value into the cache.
  status.GetMakefile().AddCacheDefinition(cacheEntry, utilityExecutable,
                                          "Path to an internal program.",
                                          cmStateEnums::FILEPATH);
  // add a value into the cache that maps from the
  // full path to the name of the project
  cmSystemTools::ConvertToUnixSlashes(utilityExecutable);
  status.GetMakefile().AddCacheDefinition(utilityExecutable, utilityName,
                                          "Executable to project name.",
                                          cmStateEnums::INTERNAL);

  return true;
}